

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerStLoopBodyCount(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  intptr_t iVar4;
  MemRefOpnd *newDst;
  undefined4 *puVar5;
  Opnd *pOVar6;
  undefined1 local_48 [8];
  AutoReuseOpnd autoReuse;
  
  iVar4 = JITTimeWorkItem::GetLoopHeaderAddr(this->m_func->m_workItem);
  newDst = IR::MemRefOpnd::New((void *)(iVar4 + 0x14),TyUint32,this->m_func,AddrOpndKindDynamicMisc)
  ;
  IR::Instr::SetDst(instr,&newDst->super_Opnd);
  pOVar6 = instr->m_src1;
  OVar2 = IR::Opnd::GetKind(pOVar6);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pOVar6 = IR::Opnd::UseWithNewType(pOVar6,TyUint32,this->m_func);
  IR::Instr::ReplaceSrc1(instr,pOVar6);
  local_48 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_48,&newDst->super_Opnd,this->m_func,true);
  LowererMD::ChangeToAssign(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_48);
  return;
}

Assistant:

void
Lowerer::LowerStLoopBodyCount(IR::Instr* instr)
{
    intptr_t header = m_func->m_workItem->GetLoopHeaderAddr();

    IR::MemRefOpnd *loopBodyCounterOpnd = IR::MemRefOpnd::New((BYTE*)(header) + Js::LoopHeader::GetOffsetOfProfiledLoopCounter(), TyUint32, this->m_func);
    instr->SetDst(loopBodyCounterOpnd);
    instr->ReplaceSrc1(instr->GetSrc1()->AsRegOpnd()->UseWithNewType(TyUint32, this->m_func));
    IR::AutoReuseOpnd autoReuse(loopBodyCounterOpnd, this->m_func);
    m_lowererMD.ChangeToAssign(instr);
    return;
}